

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

Ssw_Sml_t * Ssw_SmlSimulateComb(Aig_Man_t *pAig,int nWords)

{
  Ssw_Sml_t *p_00;
  Ssw_Sml_t *p;
  int nWords_local;
  Aig_Man_t *pAig_local;
  
  p_00 = Ssw_SmlStart(pAig,0,1,nWords);
  Ssw_SmlInitialize(p_00,0);
  Ssw_SmlSimulateOne(p_00);
  return p_00;
}

Assistant:

Ssw_Sml_t * Ssw_SmlSimulateComb( Aig_Man_t * pAig, int nWords )
{
    Ssw_Sml_t * p;
    p = Ssw_SmlStart( pAig, 0, 1, nWords );
    Ssw_SmlInitialize( p, 0 );
    Ssw_SmlSimulateOne( p );
    return p;
}